

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk4c(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk4c *peVar4;
  envy_bios_power_unk4c_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk4c *unk4c;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk4c;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk4c.version);
    if ((bios->power).unk4c.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk4c.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk4c.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk4c.entriesnum);
      (bios->power).unk4c.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk4c_entry *)malloc((ulong)(bios->power).unk4c.entriesnum << 2);
      (bios->power).unk4c.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk4c.entriesnum; data = data + 1) {
        (bios->power).unk4c.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk4c.hlen + data * (bios->power).unk4c.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERMAL ADJUSTMENT table version 0x%x\n",
              (ulong)(bios->power).unk4c.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk4c(struct envy_bios *bios) {
	struct envy_bios_power_unk4c *unk4c = &bios->power.unk4c;
	int i, err = 0;

	if (!unk4c->offset)
		return -EINVAL;

	bios_u8(bios, unk4c->offset + 0x0, &unk4c->version);
	switch(unk4c->version) {
	case 0x10:
		err |= bios_u8(bios, unk4c->offset + 0x1, &unk4c->hlen);
		err |= bios_u8(bios, unk4c->offset + 0x2, &unk4c->rlen);
		err |= bios_u8(bios, unk4c->offset + 0x3, &unk4c->entriesnum);
		unk4c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL ADJUSTMENT table version 0x%x\n", unk4c->version);
		return -EINVAL;
	};

	err = 0;
	unk4c->entries = malloc(unk4c->entriesnum * sizeof(struct envy_bios_power_unk4c_entry));
	for (i = 0; i < unk4c->entriesnum; i++) {
		uint32_t data = unk4c->offset + unk4c->hlen + i * unk4c->rlen;

		unk4c->entries[i].offset = data;
	}

	return 0;
}